

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  allocator<char> local_401;
  day_type local_400;
  month_type local_3fe;
  year_type local_3fc;
  day_type local_3fa;
  month_type local_3f8;
  year_type local_3f6;
  day_type local_3f4;
  month_type local_3f2;
  year_type local_3f0;
  day_type local_3ee;
  month_type local_3ec;
  year_type local_3ea;
  day_type local_3e8;
  month_type local_3e6;
  year_type local_3e4;
  day_type local_3e2;
  month_type local_3e0;
  year_type local_3de;
  day_type local_3dc;
  month_type local_3da;
  year_type local_3d8;
  day_type local_3d6;
  month_type local_3d4;
  year_type local_3d2;
  string local_3d0;
  User user;
  Airport airport;
  undefined1 local_2d8 [40];
  undefined1 local_2b0 [40];
  undefined1 local_288 [40];
  undefined1 local_260 [40];
  undefined1 local_238 [40];
  undefined1 local_210 [40];
  undefined1 local_1e8 [40];
  undefined1 local_1c0 [40];
  Ticket obj3;
  Ticket obj2;
  Ticket obj1;
  Ticket obj;
  
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1400,_(unsigned_short)9999,_boost::gregorian::bad_year>_>
  ::constrained_value(&local_3d2.super_greg_year_rep,0x7b7);
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1,_(unsigned_short)12,_boost::gregorian::bad_month>_>
  ::constrained_value(&local_3d4.super_greg_month_rep,1);
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1,_(unsigned_short)31,_boost::gregorian::bad_day_of_month>_>
  ::constrained_value(&local_3d6.super_greg_day_rep,2);
  boost::gregorian::date::date((date *)&user,local_3d2,local_3d4,local_3d6);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_true>
            ((pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1c0,(date *)&user,(char (*) [8])"Vietnam");
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1400,_(unsigned_short)9999,_boost::gregorian::bad_year>_>
  ::constrained_value(&local_3d8.super_greg_year_rep,0x7a3);
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1,_(unsigned_short)12,_boost::gregorian::bad_month>_>
  ::constrained_value(&local_3da.super_greg_month_rep,1);
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1,_(unsigned_short)31,_boost::gregorian::bad_day_of_month>_>
  ::constrained_value(&local_3dc.super_greg_day_rep,1);
  boost::gregorian::date::date((date *)&obj1,local_3d8,local_3da,local_3dc);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[19],_true>
            ((pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1e8,(date *)&obj1,(char (*) [19])"Sweet home Alabama");
  Ticket::Ticket(&obj,(pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_1c0,
                 (pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1e8,500.0);
  std::__cxx11::string::~string((string *)(local_1e8 + 8));
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1400,_(unsigned_short)9999,_boost::gregorian::bad_year>_>
  ::constrained_value(&local_3de.super_greg_year_rep,0x7de);
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1,_(unsigned_short)12,_boost::gregorian::bad_month>_>
  ::constrained_value(&local_3e0.super_greg_month_rep,3);
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1,_(unsigned_short)31,_boost::gregorian::bad_day_of_month>_>
  ::constrained_value(&local_3e2.super_greg_day_rep,10);
  boost::gregorian::date::date((date *)&user,local_3de,local_3e0,local_3e2);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_true>
            ((pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_210,(date *)&user,(char (*) [6])"Minsk");
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1400,_(unsigned_short)9999,_boost::gregorian::bad_year>_>
  ::constrained_value(&local_3e4.super_greg_year_rep,0x7de);
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1,_(unsigned_short)12,_boost::gregorian::bad_month>_>
  ::constrained_value(&local_3e6.super_greg_month_rep,2);
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1,_(unsigned_short)31,_boost::gregorian::bad_day_of_month>_>
  ::constrained_value(&local_3e8.super_greg_day_rep,2);
  boost::gregorian::date::date((date *)&obj2,local_3e4,local_3e6,local_3e8);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_true>
            ((pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_238,(date *)&obj2,(char (*) [7])"London");
  Ticket::Ticket(&obj1,(pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_210,
                 (pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_238,1999.0);
  std::__cxx11::string::~string((string *)(local_238 + 8));
  std::__cxx11::string::~string((string *)(local_210 + 8));
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1400,_(unsigned_short)9999,_boost::gregorian::bad_year>_>
  ::constrained_value(&local_3ea.super_greg_year_rep,0x7de);
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1,_(unsigned_short)12,_boost::gregorian::bad_month>_>
  ::constrained_value(&local_3ec.super_greg_month_rep,4);
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1,_(unsigned_short)31,_boost::gregorian::bad_day_of_month>_>
  ::constrained_value(&local_3ee.super_greg_day_rep,10);
  boost::gregorian::date::date((date *)&user,local_3ea,local_3ec,local_3ee);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_true>
            ((pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_260,(date *)&user,(char (*) [7])"Moscow");
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1400,_(unsigned_short)9999,_boost::gregorian::bad_year>_>
  ::constrained_value(&local_3f0.super_greg_year_rep,0x7de);
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1,_(unsigned_short)12,_boost::gregorian::bad_month>_>
  ::constrained_value(&local_3f2.super_greg_month_rep,4);
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1,_(unsigned_short)31,_boost::gregorian::bad_day_of_month>_>
  ::constrained_value(&local_3f4.super_greg_day_rep,2);
  boost::gregorian::date::date((date *)&obj3,local_3f0,local_3f2,local_3f4);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[10],_true>
            ((pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_288,(date *)&obj3,(char (*) [10])"Amsterdam");
  Ticket::Ticket(&obj2,(pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_260,
                 (pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_288,1999.0);
  std::__cxx11::string::~string((string *)(local_288 + 8));
  std::__cxx11::string::~string((string *)(local_260 + 8));
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1400,_(unsigned_short)9999,_boost::gregorian::bad_year>_>
  ::constrained_value(&local_3f6.super_greg_year_rep,0x7de);
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1,_(unsigned_short)12,_boost::gregorian::bad_month>_>
  ::constrained_value(&local_3f8.super_greg_month_rep,5);
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1,_(unsigned_short)31,_boost::gregorian::bad_day_of_month>_>
  ::constrained_value(&local_3fa.super_greg_day_rep,10);
  boost::gregorian::date::date((date *)&user,local_3f6,local_3f8,local_3fa);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_true>
            ((pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_2b0,(date *)&user,(char (*) [6])"Minsk");
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1400,_(unsigned_short)9999,_boost::gregorian::bad_year>_>
  ::constrained_value(&local_3fc.super_greg_year_rep,0x7de);
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1,_(unsigned_short)12,_boost::gregorian::bad_month>_>
  ::constrained_value(&local_3fe.super_greg_month_rep,5);
  boost::CV::
  constrained_value<boost::CV::simple_exception_policy<unsigned_short,_(unsigned_short)1,_(unsigned_short)31,_boost::gregorian::bad_day_of_month>_>
  ::constrained_value(&local_400.super_greg_day_rep,3);
  boost::gregorian::date::date((date *)&airport,local_3fc,local_3fe,local_400);
  std::
  pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_true>
            ((pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_2d8,(date *)&airport,(char (*) [7])"London");
  Ticket::Ticket(&obj3,(pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_2b0,
                 (pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_2d8,1999.0);
  std::__cxx11::string::~string((string *)(local_2d8 + 8));
  std::__cxx11::string::~string((string *)(local_2b0 + 8));
  Airport::Airport(&airport);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&user,"Sheremetyevo - A.S. Pushkin international airport",
             (allocator<char> *)&local_3d0);
  Airport::set_name(&airport,(string *)&user);
  std::__cxx11::string::~string((string *)&user);
  user.tickets.super__List_base<Ticket,_std::allocator<Ticket>_>._M_impl._M_node.
  super__List_node_base._M_next._0_4_ = 2;
  Airport::set_runway_strips(&airport,(uint *)&user);
  Airport::push_ticket(&airport,&obj);
  Airport::push_ticket(&airport,&obj1);
  Airport::push_ticket(&airport,&obj2);
  Airport::push_ticket(&airport,&obj3);
  User::User(&user);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"Egor",&local_401);
  User::set_first_name(&user,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"Sviridenko",&local_401);
  User::set_second_name(&user,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  local_3d0._M_dataplus._M_p._0_4_ = 0x13;
  User::set_age(&user,(int *)&local_3d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"123123123123",&local_401)
  ;
  User::set_passport_id(&user,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  menu(&airport,&user);
  User::~User(&user);
  Airport::~Airport(&airport);
  Ticket::~Ticket(&obj3);
  Ticket::~Ticket(&obj2);
  Ticket::~Ticket(&obj1);
  Ticket::~Ticket(&obj);
  return 0;
}

Assistant:

int main()
{

Ticket obj({{1975, 1, 2},"Vietnam"},{{1955,1,1},"Sweet home Alabama"},500);
Ticket obj1({{2014, 3, 10},"Minsk"},{{2014,2,2},"London"},1999);

Ticket obj2({{2014, 4, 10},"Moscow"},{{2014,4,2},"Amsterdam"},1999);
Ticket obj3({{2014, 5, 10},"Minsk"},{{2014,5,3},"London"},1999);


Airport airport;
airport.set_name("Sheremetyevo - A.S. Pushkin international airport");
airport.set_runway_strips(2);
airport.push_ticket(obj);
airport.push_ticket(obj1);
airport.push_ticket(obj2);
airport.push_ticket(obj3);


User user;
user.set_first_name("Egor");
user.set_second_name("Sviridenko");
user.set_age(19);
user.set_passport_id("123123123123"); // without correct passport id(only digits) user can't buy any tickets.
menu(airport,user);


//airport.delete_ticket(1); //cancel flight for example
/*
std::cout << "Show available tickets in the airport" << std::endl;
airport.show();
std::cout << std::endl;
std::cout << std::endl;
*/

//user.set_passport_id("12344125643AFDAFDAF"); // validation works;

/*
//user.buy_tickets(airport,1);
//user.buy_tickets(airport,2);
std::cout << "Show user's personal data" << std::endl;
user.show_info();
std::cout << std::endl;

std::cout << "Find ticket with rule example"<< std::endl;
user.find_ticket(airport,"20140502","20140512","London","Minsk");
//  "20140502","20140512" - data period, in which algorithm will search available tickets with given cities.
std::cout << "____________________" << std::endl;
user.buyuser's wallet and info_tickets(airport,4);
std::cout << "Find ticket with rule example(Already bought)"<< std::endl;
std::cout << std::endl;
std::cout << "____________________"<<std::endl;
//user.find_ticket(airport,"19520105","20000302","Sweet home Alabama","Vietnam");
std::cout <<"Showing tickets that are available in airport right now" << std::endl;
airport.show();
std::cout << std::endl;
std::cout << "Show user's information and his wallet" << std::endl;
//user.show_info();
//user.cancel_flight(); TODO in future . move back from std::list ticket pair to airport

//to_file(airport,"data.data");// works exception with regex match txt file
//to_file(airport,"data.txt");
//save_users_wallet(user,"wallet.txt");
*/
}